

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O0

void __thiscall TileGate::addUpdate(TileGate *this,bool isCosmetic,bool noAdjacentUpdates)

{
  byte in_DL;
  byte in_SIL;
  Tile *in_RDI;
  Tile *in_stack_00000010;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  unordered_set<Tile_*,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<Tile_*>_>
  *in_stack_ffffffffffffffd0;
  
  Tile::getBoardPtr(in_RDI);
  std::unordered_set<Tile_*,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<Tile_*>_>::
  insert(in_stack_ffffffffffffffd0,
         (value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  if ((in_SIL & 1) == 0) {
    Tile::getBoardPtr(in_RDI);
    std::
    unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
    ::insert((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
              *)in_RDI,(value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    if ((in_DL & 1) == 0) {
      Tile::_updateAdjacentTiles(in_stack_00000010);
    }
    *(undefined1 *)&in_RDI[1]._direction = EAST;
  }
  return;
}

Assistant:

void TileGate::addUpdate(bool isCosmetic, bool noAdjacentUpdates) {
    getBoardPtr()->cosmeticUpdates.insert(this);
    if (!isCosmetic) {
        getBoardPtr()->gateUpdates.insert(this);
        if (!noAdjacentUpdates) {
            _updateAdjacentTiles();
        }
        _connectorChange = true;
    }
}